

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyPointerDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to)

{
  uint32_t uVar1;
  DecorationManager *this_00;
  Instruction *pIVar2;
  pointer ppIVar3;
  initializer_list<unsigned_int> init_list;
  uint32_t local_84;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  Instruction *local_78;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_70
  ;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_78 = to;
  this_00 = Pass::get_decoration_mgr((Pass *)this);
  uVar1 = Instruction::result_id(from);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_70,this_00,uVar1,false);
  for (ppIVar3 = local_70._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 != local_70._M_impl.super__Vector_impl_data._M_finish; ppIVar3 = ppIVar3 + 1) {
    pIVar2 = *ppIVar3;
    uVar1 = Instruction::GetSingleWordInOperand(pIVar2,1);
    if (uVar1 - 0x14eb < 2) {
      pIVar2 = Instruction::Clone(pIVar2,(this->super_MemPass).super_Pass.context_);
      local_80._M_head_impl = pIVar2;
      local_84 = Instruction::result_id(local_78);
      init_list._M_len = 1;
      init_list._M_array = &local_84;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      Instruction::SetInOperand(pIVar2,0,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      IRContext::AddAnnotationInst
                ((this->super_MemPass).super_Pass.context_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_80);
      if (local_80._M_head_impl != (Instruction *)0x0) {
        (*((local_80._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_70);
  return;
}

Assistant:

void ScalarReplacementPass::CopyPointerDecorationsToVariable(Instruction* from,
                                                             Instruction* to) {
  // The RestrictPointer and AliasedPointer decorations are copied to all
  // members even if the new variable does not contain a pointer. It does
  // not hurt to do so.
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(from->result_id(), false)) {
    uint32_t decoration;
    decoration = dec_inst->GetSingleWordInOperand(1u);
    switch (spv::Decoration(decoration)) {
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer: {
        std::unique_ptr<Instruction> new_dec_inst(dec_inst->Clone(context()));
        new_dec_inst->SetInOperand(0, {to->result_id()});
        context()->AddAnnotationInst(std::move(new_dec_inst));
      } break;
      default:
        break;
    }
  }
}